

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graph.cpp
# Opt level: O2

string * __thiscall
GraphPropagator::available_to_dot_abi_cxx11_(string *__return_storage_ptr__,GraphPropagator *this)

{
  BoolView *pBVar1;
  bool bVar2;
  long lVar3;
  int n;
  long lVar4;
  long local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__,"graph {\n",(allocator *)&local_b0);
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < (int)(this->vs).sz; lVar4 = lVar4 + 1) {
    pBVar1 = (this->vs).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar3)] != '\0') {
      bVar2 = BoolView::isTrue((BoolView *)
                               ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar3))
      ;
      if (bVar2) {
        std::__cxx11::to_string(&local_90,(int)lVar4);
        std::operator+(&local_d0," ",&local_90);
        std::operator+(&local_b0,&local_d0," [color = red];\n");
        std::__cxx11::string::append((string *)__return_storage_ptr__);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&local_d0);
        std::__cxx11::string::~string((string *)&local_90);
      }
    }
    lVar3 = lVar3 + 0x10;
  }
  lVar4 = 0;
  local_d8 = 0;
  lVar3 = 0;
  do {
    if ((int)(this->es).sz <= lVar3) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    pBVar1 = (this->es).data;
    if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] == '\0') {
LAB_001a39cb:
      std::__cxx11::to_string
                (&local_50,
                 **(int **)((long)&(((this->endnodes).
                                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->
                                   super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data + local_d8));
      std::operator+(&local_90," ",&local_50);
      std::operator+(&local_d0,&local_90," -- ");
      std::__cxx11::to_string
                (&local_70,
                 *(int *)(*(long *)((long)&(((this->endnodes).
                                             super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                                             ._M_impl.super__Vector_impl_data._M_start)->
                                           super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                           super__Vector_impl_data + local_d8) + 4));
      std::operator+(&local_b0,&local_d0,&local_70);
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_50);
      pBVar1 = (this->es).data;
      if (sat.assigns.data[*(uint *)((long)&pBVar1->v + lVar4)] != '\0') {
        bVar2 = BoolView::isTrue((BoolView *)
                                 ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar4
                                 ));
        if (bVar2) {
          std::__cxx11::string::append((char *)__return_storage_ptr__);
        }
      }
      std::__cxx11::to_string(&local_90,(int)lVar3);
      std::operator+(&local_d0,"[label = \"",&local_90);
      std::operator+(&local_b0,&local_d0,"\"]");
      std::__cxx11::string::append((string *)__return_storage_ptr__);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      bVar2 = BoolView::isTrue((BoolView *)
                               ((long)&(pBVar1->super_Var).super_Branching._vptr_Branching + lVar4))
      ;
      if (bVar2) goto LAB_001a39cb;
    }
    lVar3 = lVar3 + 1;
    local_d8 = local_d8 + 0x18;
    lVar4 = lVar4 + 0x10;
  } while( true );
}

Assistant:

std::string GraphPropagator::available_to_dot() {
	std::string res = "graph {\n";
	for (int n = 0; n < nbNodes(); n++) {
		if (getNodeVar(n).isFixed() && getNodeVar(n).isTrue()) {
			res += " " + std::to_string(n) + " [color = red];\n";
		}
	}
	for (int e = 0; e < nbEdges(); e++) {
		if (!getEdgeVar(e).isFixed() || getEdgeVar(e).isTrue()) {
			res += " " + std::to_string(getTail(e)) + " -- " + std::to_string(getHead(e));
			if (getEdgeVar(e).isFixed() && getEdgeVar(e).isTrue()) {
				res += " [color = red] ";
			}
			res += "[label = \"" + std::to_string(e) + "\"]";
			res += ";\n";
		}
	}
	res += "}";

	return res;
}